

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

uint8_t * __thiscall HEVCStreamReader::writeNalPrefix(HEVCStreamReader *this,uint8_t *curPos)

{
  if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
    *curPos = '\0';
    curPos = curPos + 1;
  }
  curPos[0] = '\0';
  curPos[1] = '\0';
  curPos[2] = '\x01';
  return curPos + 3;
}

Assistant:

uint8_t* HEVCStreamReader::writeNalPrefix(uint8_t* curPos) const
{
    if (!m_shortStartCodes)
        *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 1;
    return curPos;
}